

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenTupleExtract(BinaryenModuleRef module,BinaryenExpressionRef tuple,BinaryenIndex index)

{
  TupleExtract *pTVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pTVar1 = wasm::Builder::makeTupleExtract(&local_10,tuple,index);
  return (BinaryenExpressionRef)pTVar1;
}

Assistant:

BinaryenExpressionRef BinaryenTupleExtract(BinaryenModuleRef module,
                                           BinaryenExpressionRef tuple,
                                           BinaryenIndex index) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeTupleExtract((Expression*)tuple, index));
}